

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QPersistentModelIndex,QEditorInfo>::emplace_helper<QEditorInfo_const&>
          (QHash<QPersistentModelIndex,QEditorInfo> *this,QPersistentModelIndex *key,
          QEditorInfo *args)

{
  QPersistentModelIndexData *pQVar1;
  Data *pDVar2;
  piter pVar3;
  Node<QPersistentModelIndex,QEditorInfo> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::
  findOrInsert<QPersistentModelIndex>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> **)this,key);
  this_00 = (Node<QPersistentModelIndex,QEditorInfo> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    pQVar1 = key->d;
    key->d = (QPersistentModelIndexData *)0x0;
    *(QPersistentModelIndexData **)this_00 = pQVar1;
    pDVar2 = (args->widget).wp.d;
    *(Data **)(this_00 + 8) = pDVar2;
    *(QObject **)(this_00 + 0x10) = (args->widget).wp.value;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + 1;
      UNLOCK();
    }
    this_00[0x18] = (Node<QPersistentModelIndex,QEditorInfo>)args->isStatic;
  }
  else {
    QHashPrivate::Node<QPersistentModelIndex,QEditorInfo>::emplaceValue<QEditorInfo_const&>
              (this_00,args);
  }
  pVar3.bucket = local_38._8_8_;
  pVar3.d = (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }